

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

ON_wString __thiscall ON_ModelComponent::NameReferencePrefix(ON_ModelComponent *this,wchar_t *name)

{
  long lVar1;
  wchar_t *pwVar2;
  long lVar3;
  
  if ((name == (wchar_t *)0x0) || (*name == L'\0')) {
LAB_0053aa58:
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  else {
    lVar3 = -4;
    do {
      lVar1 = lVar3 + 4;
      lVar3 = lVar3 + 4;
    } while (*(int *)((long)name + lVar1) != 0);
    do {
      if ((wchar_t *)((long)name + lVar3) <= name) goto LAB_0053aa58;
      pwVar2 = ON_wString::operator_cast_to_wchar_t_(&ReferencePrefixDelimiter);
      pwVar2 = InternalStringBeginsWithToken((wchar_t *)((long)name + lVar3 + -4),pwVar2);
      lVar3 = lVar3 + -4;
    } while (pwVar2 == (wchar_t *)0x0);
    ON_wString::ON_wString((ON_wString *)this,name);
    ON_wString::SetLength((ON_wString *)this,lVar3 >> 2);
    pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
    RemoveAllReferencePrefixDelimiters((ON_ModelComponent *)&stack0xffffffffffffffd0,pwVar2);
    ON_wString::operator=((ON_wString *)this,(ON_wString *)&stack0xffffffffffffffd0);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd0);
    ON_wString::TrimLeftAndRight((ON_wString *)this,(wchar_t *)0x0);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_ModelComponent::NameReferencePrefix(const wchar_t * name)
{
  if (nullptr == name || 0 == name[0])
    return ON_wString::EmptyString;
  const wchar_t* tail = name;
  while (0 != *tail)
    tail++;

  while (tail > name)
  {
    tail--;
    const wchar_t* s = ON_ModelComponent::IsReferencePrefixDelimiter(tail);
    if (nullptr != s)
    {
      ON_wString name_reference = name;
      name_reference.SetLength(tail - name);
      name_reference = ON_ModelComponent::RemoveAllReferencePrefixDelimiters(name_reference);
      name_reference.TrimLeftAndRight();
      return name_reference;
    }
  }

  return ON_wString::EmptyString;  
}